

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# armci.c
# Opt level: O0

int PARMCI_NbGetS(void *src_ptr,int *src_stride_arr,void *dst_ptr,int *dst_stride_arr,int *count,
                 int stride_levels,int proc,armci_hdl_t *nb_handle)

{
  int iVar1;
  int *in_RCX;
  int *in_RSI;
  comex_group_t in_EDI;
  int *in_R8;
  int in_R9D;
  comex_request_t *unaff_retaddr;
  undefined8 in_stack_00000010;
  int lcount;
  int i;
  int iret;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  undefined8 in_stack_ffffffffffffffb8;
  comex_group_t group;
  int in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffc4;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  int iVar2;
  undefined4 in_stack_ffffffffffffffd0;
  
  group = (comex_group_t)((ulong)in_stack_ffffffffffffffb8 >> 0x20);
  iVar1 = armci_check_contiguous(in_RSI,in_RCX,in_R8,in_R9D);
  if (iVar1 == 0) {
    iVar1 = comex_nbgets(in_RCX,in_R8,(void *)CONCAT44(in_R9D,in_stack_ffffffffffffffd0),
                         (int *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                         (int *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                         in_stack_00000010._4_4_,(int)in_RSI,in_EDI,unaff_retaddr);
  }
  else {
    iVar1 = 1;
    for (iVar2 = 0; iVar2 <= in_R9D; iVar2 = iVar2 + 1) {
      iVar1 = in_R8[iVar2] * iVar1;
    }
    iVar1 = comex_nbget((void *)CONCAT44(in_R9D,in_stack_ffffffffffffffd0),
                        (void *)CONCAT44(iVar2,iVar1),in_stack_ffffffffffffffc4,
                        in_stack_ffffffffffffffc0,group,
                        (comex_request_t *)
                        CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
  }
  return iVar1;
}

Assistant:

int PARMCI_NbGetS(void *src_ptr, int *src_stride_arr, void *dst_ptr, int *dst_stride_arr, int *count, int stride_levels, int proc, armci_hdl_t *nb_handle)
{
  int iret;
  /* check if data is contiguous */
  if (armci_check_contiguous(src_stride_arr, dst_stride_arr, count, stride_levels)) {
    int i;
    int lcount = 1;
    for (i=0; i<=stride_levels; i++) lcount *= count[i];
    iret = comex_nbget(src_ptr, dst_ptr, lcount, proc,
        COMEX_GROUP_WORLD, nb_handle);
  } else {
    iret = comex_nbgets(src_ptr, src_stride_arr, dst_ptr, dst_stride_arr,
        count, stride_levels, proc, COMEX_GROUP_WORLD, nb_handle);
  }
  return iret;
}